

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setSliceGeomUniforms(SlicePlane *this,ShaderProgram *p)

{
  bool bVar1;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  col_type cVar4;
  vec3 vVar5;
  allocator local_8d;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_8c;
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_78;
  undefined1 local_68 [16];
  string local_50 [32];
  string local_30 [32];
  
  auVar3 = in_ZMM0._8_56_;
  vVar5 = getNormal(this);
  local_8c = vVar5.field_2;
  auVar2._0_8_ = vVar5._0_8_;
  auVar2._8_56_ = auVar3;
  local_68 = auVar2._0_16_;
  local_88._0_8_ = vmovlps_avx(local_68);
  local_88.field_2 = local_8c;
  std::__cxx11::string::string(local_30,"u_sliceVector",(allocator *)&local_78);
  (*p->_vptr_ShaderProgram[9])(local_68._0_8_,(ulong)(uint)local_8c,p,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::string(local_50,"u_slicePoint",&local_8d);
  bVar1 = (this->active).value;
  local_78.field_2.z = (uint)(bVar1 & 1) * (this->objectTransform).value.value[3].field_2;
  if (bVar1 == false) {
    cVar4 = SUB6416(ZEXT464(0x7f800000),0);
  }
  else {
    cVar4 = (this->objectTransform).value.value[3];
  }
  local_78._0_8_ = vmovlps_avx((undefined1  [16])cVar4);
  glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
            (&local_78,&local_88);
  (*p->_vptr_ShaderProgram[5])(p,local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void SlicePlane::setSliceGeomUniforms(render::ShaderProgram& p) {
  glm::vec3 norm = getNormal();
  p.setUniform("u_sliceVector", norm);
  p.setUniform("u_slicePoint", glm::dot(getCenter(), norm));
}